

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O2

uint __thiscall
pktalloc::CustomBitSet<2048U>::FindFirstClear(CustomBitSet<2048U> *this,uint bitStart)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(bitStart >> 6);
  uVar4 = ~*(ulong *)(this + uVar3 * 8) >> ((ulong)bitStart & 0x3f);
  if (uVar4 == 0) {
    bitStart = bitStart & 0xffffffc0;
    do {
      if (0x1e < uVar3) {
        return 0x800;
      }
      lVar1 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      bitStart = bitStart + 0x40;
    } while (*(ulong *)(this + lVar1 + 8) == 0xffffffffffffffff);
    iVar2 = 0;
    for (uVar3 = ~*(ulong *)(this + lVar1 + 8); (uVar3 & 1) == 0;
        uVar3 = uVar3 >> 1 | 0x8000000000000000) {
      iVar2 = iVar2 + 1;
    }
  }
  else {
    iVar2 = 0;
    for (uVar3 = uVar4; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
      iVar2 = iVar2 + 1;
    }
    if ((uVar4 & 1) != 0) {
      iVar2 = 0;
    }
  }
  return iVar2 + bitStart;
}

Assistant:

unsigned FindFirstClear(const unsigned bitStart)
    {
        static_assert(kWordBits == 64, "Update this");

        const unsigned wordStart = bitStart / kWordBits;

        WordT word = ~Words[wordStart] >> (bitStart % kWordBits);
        if (word != 0)
        {
            unsigned offset = 0;
            if ((word & 1) == 0) {
                offset = TrailingZeros64(word);
            }
            return bitStart + offset;
        }

        for (unsigned i = wordStart + 1; i < kWords; ++i)
        {
            word = ~Words[i];
            if (word != 0) {
                return i * kWordBits + TrailingZeros64(word);
            }
        }

        return kValidBits;
    }